

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unbuf.cc
# Opt level: O1

void __thiscall bsplib::Unbuf::Unbuf(Unbuf *this,size_t max_msg_size,MPI_Comm comm)

{
  this->m_pid = -1;
  this->m_nprocs = -1;
  this->m_comm = (MPI_Comm)&ompi_mpi_comm_null;
  this->m_max_msg_size = max_msg_size;
  (this->m_sends).super__Vector_base<bsplib::Unbuf::Entry,_std::allocator<bsplib::Unbuf::Entry>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_sends).super__Vector_base<bsplib::Unbuf::Entry,_std::allocator<bsplib::Unbuf::Entry>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_sends).super__Vector_base<bsplib::Unbuf::Entry,_std::allocator<bsplib::Unbuf::Entry>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_recvs).super__Vector_base<bsplib::Unbuf::Entry,_std::allocator<bsplib::Unbuf::Entry>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_recvs).super__Vector_base<bsplib::Unbuf::Entry,_std::allocator<bsplib::Unbuf::Entry>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_recvs).super__Vector_base<bsplib::Unbuf::Entry,_std::allocator<bsplib::Unbuf::Entry>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_reqs).super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_reqs).super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_reqs).super__Vector_base<ompi_request_t_*,_std::allocator<ompi_request_t_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->m_ready).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->m_ready).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->m_ready).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  MPI_Comm_dup(comm,&this->m_comm);
  MPI_Comm_size(this->m_comm,&this->m_nprocs);
  MPI_Comm_rank(this->m_comm,this);
  return;
}

Assistant:

Unbuf::Unbuf( size_t max_msg_size, MPI_Comm comm)
   : m_pid(-1), m_nprocs(-1)
   , m_comm(MPI_COMM_NULL)
   , m_max_msg_size( max_msg_size )
{
    MPI_Comm_dup( comm, &m_comm );
    MPI_Comm_size( m_comm, &m_nprocs );
    MPI_Comm_rank( m_comm, &m_pid );
}